

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArray.H
# Opt level: O0

void __thiscall
amrex::FabArray<amrex::EBCellFlagFab>::FabArray(FabArray<amrex::EBCellFlagFab> *this)

{
  FabArrayStats *in_RDI;
  FabArrayBase *unaff_retaddr;
  
  FabArrayBase::FabArrayBase(unaff_retaddr);
  *(undefined ***)in_RDI = &PTR__FabArray_01aa2d90;
  std::
  unique_ptr<amrex::FabFactory<amrex::EBCellFlagFab>,std::default_delete<amrex::FabFactory<amrex::EBCellFlagFab>>>
  ::unique_ptr<std::default_delete<amrex::FabFactory<amrex::EBCellFlagFab>>,void>
            ((unique_ptr<amrex::FabFactory<amrex::EBCellFlagFab>,_std::default_delete<amrex::FabFactory<amrex::EBCellFlagFab>_>_>
              *)in_RDI);
  DataAllocator::DataAllocator((DataAllocator *)&in_RDI[10].max_num_boxarrays);
  *(undefined1 *)&in_RDI[10].num_build = 0;
  std::vector<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>::vector
            ((vector<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_> *)0x750fa2);
  *(__uniq_ptr_data<amrex::FBData<amrex::EBCellFlagFab>,_std::default_delete<amrex::FBData<amrex::EBCellFlagFab>_>,_true,_true>
    *)(in_RDI + 0xc) =
       (__uniq_ptr_data<amrex::FBData<amrex::EBCellFlagFab>,_std::default_delete<amrex::FBData<amrex::EBCellFlagFab>_>,_true,_true>
        )0x0;
  MultiArray4<amrex::EBCellFlag>::MultiArray4
            ((MultiArray4<amrex::EBCellFlag> *)&in_RDI[0xc].max_num_boxarrays);
  MultiArray4<const_amrex::EBCellFlag>::MultiArray4
            ((MultiArray4<const_amrex::EBCellFlag> *)&in_RDI[0xc].num_build);
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::Vector((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x750fe0);
  ShMem::ShMem((ShMem *)(in_RDI + 0xe));
  std::
  unique_ptr<amrex::FBData<amrex::EBCellFlagFab>,std::default_delete<amrex::FBData<amrex::EBCellFlagFab>>>
  ::unique_ptr<std::default_delete<amrex::FBData<amrex::EBCellFlagFab>>,void>
            ((unique_ptr<amrex::FBData<amrex::EBCellFlagFab>,_std::default_delete<amrex::FBData<amrex::EBCellFlagFab>_>_>
              *)in_RDI);
  std::
  unique_ptr<amrex::PCData<amrex::EBCellFlagFab>,std::default_delete<amrex::PCData<amrex::EBCellFlagFab>>>
  ::unique_ptr<std::default_delete<amrex::PCData<amrex::EBCellFlagFab>>,void>
            ((unique_ptr<amrex::PCData<amrex::EBCellFlagFab>,_std::default_delete<amrex::PCData<amrex::EBCellFlagFab>_>_>
              *)in_RDI);
  std::
  unique_ptr<amrex::FabArray<amrex::EBCellFlagFab>,std::default_delete<amrex::FabArray<amrex::EBCellFlagFab>>>
  ::unique_ptr<std::default_delete<amrex::FabArray<amrex::EBCellFlagFab>>,void>
            ((unique_ptr<amrex::FabArray<amrex::EBCellFlagFab>,_std::default_delete<amrex::FabArray<amrex::EBCellFlagFab>_>_>
              *)in_RDI);
  FabArrayBase::FabArrayStats::recordBuild(in_RDI);
  return;
}

Assistant:

FabArray<FAB>::FabArray () noexcept
    : shmem()
{
    m_FA_stats.recordBuild();
}